

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::setCapacity
          (Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *this,
          size_t newSize)

{
  DataLocation *pDVar1;
  DataLocation *__dest;
  size_t __n;
  ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> local_38;
  
  pDVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pDVar1 >> 3)) {
    (this->builder).pos = pDVar1 + newSize;
  }
  __dest = kj::_::HeapArrayDisposer::
           allocateUninitialized<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>
                     (newSize);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pDVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pDVar1;
  local_38.ptr = __dest;
  if (__n != 0) {
    memcpy(__dest,pDVar1,__n);
  }
  local_38.pos = (RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> *)
                 ((long)__dest + __n);
  ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::operator=
            (&this->builder,&local_38);
  ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::dispose
            (&local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }